

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O0

void duckdb::QuantileScalarOperation<true,duckdb::QuantileStandardType>::
     Finalize<signed_char,duckdb::QuantileState<signed_char,duckdb::QuantileStandardType>>
               (QuantileState<signed_char,_duckdb::QuantileStandardType> *state,char *target,
               AggregateFinalizeData *finalize_data)

{
  bool bVar1;
  char cVar2;
  reference accessor;
  AggregateFinalizeData *in_RSI;
  vector<signed_char,_std::allocator<signed_char>_> *in_RDI;
  Interpolator<true> interp;
  QuantileBindData *bind_data;
  size_type in_stack_ffffffffffffffa8;
  Vector *in_stack_ffffffffffffffb0;
  QuantileValue *in_stack_ffffffffffffffb8;
  Interpolator<true> *in_stack_ffffffffffffffc0;
  
  bVar1 = std::vector<signed_char,_std::allocator<signed_char>_>::empty
                    ((vector<signed_char,_std::allocator<signed_char>_> *)in_stack_ffffffffffffffc0)
  ;
  if (bVar1) {
    AggregateFinalizeData::ReturnNull(in_RSI);
  }
  else {
    optional_ptr<duckdb::FunctionData,_true>::operator->
              ((optional_ptr<duckdb::FunctionData,_true> *)in_stack_ffffffffffffffb0);
    FunctionData::Cast<duckdb::QuantileBindData>((FunctionData *)in_stack_ffffffffffffffb0);
    accessor = vector<duckdb::QuantileValue,_true>::operator[]
                         ((vector<duckdb::QuantileValue,_true> *)in_stack_ffffffffffffffb0,
                          in_stack_ffffffffffffffa8);
    std::vector<signed_char,_std::allocator<signed_char>_>::size(in_RDI);
    Interpolator<true>::Interpolator
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(idx_t)in_stack_ffffffffffffffb0,
               SUB81((ulong)accessor >> 0x38,0));
    std::vector<signed_char,_std::allocator<signed_char>_>::data
              ((vector<signed_char,_std::allocator<signed_char>_> *)0x9f90b5);
    cVar2 = Interpolator<true>::
            Operation<signed_char,signed_char,duckdb::QuantileDirect<signed_char>>
                      (in_stack_ffffffffffffffc0,(char *)in_stack_ffffffffffffffb8,
                       in_stack_ffffffffffffffb0,(QuantileDirect<signed_char> *)accessor);
    *(char *)&in_RSI->result = cVar2;
  }
  return;
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (state.v.empty()) {
			finalize_data.ReturnNull();
			return;
		}
		D_ASSERT(finalize_data.input.bind_data);
		auto &bind_data = finalize_data.input.bind_data->Cast<QuantileBindData>();
		D_ASSERT(bind_data.quantiles.size() == 1);
		Interpolator<DISCRETE> interp(bind_data.quantiles[0], state.v.size(), bind_data.desc);
		target = interp.template Operation<typename STATE::InputType, T>(state.v.data(), finalize_data.result);
	}